

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::GenerateAggregateInitializer
          (Map *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    io::Printer::Emit(p,0x7c,
                      "\n        /* decltype($Msg$::Split::$name$_) */ {\n            $pbi$::ArenaInitialized(),\n            arena,\n        },\n      "
                     );
    return;
  }
  io::Printer::Emit(p,0x4c,
                    "\n        /* decltype($field_$) */ {$pbi$::ArenaInitialized(), arena},\n      "
                   );
  return;
}

Assistant:

void GenerateAggregateInitializer(io::Printer* p) const override {
    if (should_split()) {
      p->Emit(R"cc(
        /* decltype($Msg$::Split::$name$_) */ {
            $pbi$::ArenaInitialized(),
            arena,
        },
      )cc");
    } else {
      p->Emit(R"cc(
        /* decltype($field_$) */ {$pbi$::ArenaInitialized(), arena},
      )cc");
    }
  }